

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O0

int Nwk_ManPiNum(Nwk_Man_t *pNtk)

{
  int iVar1;
  Nwk_Obj_t *p;
  int local_20;
  int local_1c;
  int Counter;
  int i;
  Nwk_Obj_t *pNode;
  Nwk_Man_t *pNtk_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(pNtk->vCis), local_1c < iVar1; local_1c = local_1c + 1) {
    p = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vCis,local_1c);
    iVar1 = Nwk_ObjIsPi(p);
    local_20 = iVar1 + local_20;
  }
  return local_20;
}

Assistant:

int Nwk_ManPiNum( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pNode;
    int i, Counter = 0;
    Nwk_ManForEachCi( pNtk, pNode, i )
        Counter += Nwk_ObjIsPi( pNode );
    return Counter;
}